

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_error_mixed.c
# Opt level: O0

void test_error_mixed(void)

{
  char *unaff_retaddr;
  char *in_stack_00000008;
  char *reffile3;
  char *reffile2;
  char *reffile1;
  char *in_stack_00000068;
  wchar_t in_stack_00000074;
  char *in_stack_00000078;
  char *in_stack_000003f0;
  char *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  char *v1;
  char *pcVar1;
  char *file;
  
  file = "test_expand.plain";
  pcVar1 = "test_expand.error";
  v1 = "test_expand.Z";
  assertion_file_not_exists("test_expand.Z",in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  extract_reference_file(in_stack_000003f0);
  extract_reference_file(in_stack_000003f0);
  systemf("%s %s %s %s >test.out 2>test.err",testprog,file,pcVar1,v1);
  assertion_equal_int(file,(wchar_t)((ulong)pcVar1 >> 0x20),(longlong)v1,
                      (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                      (char *)0x10977a,(void *)CONCAT44(reffile3._4_4_,reffile3._0_4_));
  assertion_text_file_contents(reffile2,reffile3._4_4_,in_stack_00000008,unaff_retaddr);
  assertion_non_empty_file(in_stack_00000078,in_stack_00000074,in_stack_00000068);
  return;
}

Assistant:

DEFINE_TEST(test_error_mixed)
{
	const char *reffile1 = "test_expand.plain";
	const char *reffile2 = "test_expand.error";
	const char *reffile3 = "test_expand.Z";

	assertFileNotExists(reffile2);
	extract_reference_file(reffile1);
	extract_reference_file(reffile3);
	assertEqualInt(256, systemf("%s %s %s %s >test.out 2>test.err",
	    testprog, reffile1, reffile2, reffile3));

	assertTextFileContents(
	    "contents of test_expand.plain.\n"
	    "contents of test_expand.Z.\n", "test.out");
	assertNonEmptyFile("test.err");
}